

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O2

void __thiscall options::options(options *this,uint argc,char **argv)

{
  bool bVar1;
  long lVar2;
  allocator local_62;
  allocator local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  this->valid = true;
  if (argc == 3) {
    lVar2 = atol(argv[1]);
    this->Lx = (uint)lVar2;
    lVar2 = atol(argv[2]);
    this->Ly = (uint)lVar2;
  }
  else {
    if (argc == 2) {
      std::__cxx11::string::string((string *)&local_60,argv[1],&local_61);
      bVar1 = std::operator==(&local_60,"-h");
      if (bVar1) {
        std::__cxx11::string::~string((string *)&local_60);
      }
      else {
        std::__cxx11::string::string((string *)&local_40,argv[1],&local_62);
        bVar1 = std::operator==(&local_40,"--help");
        std::__cxx11::string::~string((string *)&local_40);
        std::__cxx11::string::~string((string *)&local_60);
        if (!bVar1) {
          lVar2 = atol(argv[1]);
          this->Ly = (uint)lVar2;
          this->Lx = (uint)lVar2;
          return;
        }
      }
      help_abi_cxx11_(&local_60,this,*argv);
      std::operator<<((ostream *)&std::cerr,(string *)&local_60);
    }
    else {
      help_abi_cxx11_(&local_60,this,*argv);
      std::operator<<((ostream *)&std::cerr,(string *)&local_60);
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  return;
}

Assistant:

options(unsigned argc, char *argv[]) : valid(true) {
    switch (argc) {
    case 2:
      if (std::string(argv[1]) == "-h" || std::string(argv[1]) == "--help")
        std::cerr << help(argv[0]);
      else
        Lx = Ly = std::atol(argv[1]);
      return;
    case 3:
      Lx = std::atol(argv[1]);
      Ly = std::atol(argv[2]);
      return;
    default:
      std::cerr << help(argv[0]);
      return;
    }
  }